

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timer_queue.hpp
# Opt level: O0

long __thiscall
asio::detail::timer_queue<asio::detail::forwarding_posix_time_traits>::wait_duration_msec
          (timer_queue<asio::detail::forwarding_posix_time_traits> *this,long max_duration)

{
  bool bVar1;
  const_reference t1;
  time_type local_38;
  duration_type local_30;
  time_duration local_28;
  timer_queue<asio::detail::forwarding_posix_time_traits> *local_20;
  long max_duration_local;
  timer_queue<asio::detail::forwarding_posix_time_traits> *this_local;
  
  local_20 = (timer_queue<asio::detail::forwarding_posix_time_traits> *)max_duration;
  max_duration_local = (long)this;
  bVar1 = std::
          vector<asio::detail::timer_queue<asio::detail::forwarding_posix_time_traits>::heap_entry,_std::allocator<asio::detail::timer_queue<asio::detail::forwarding_posix_time_traits>::heap_entry>_>
          ::empty(&this->heap_);
  if (bVar1) {
    this_local = local_20;
  }
  else {
    t1 = std::
         vector<asio::detail::timer_queue<asio::detail::forwarding_posix_time_traits>::heap_entry,_std::allocator<asio::detail::timer_queue<asio::detail::forwarding_posix_time_traits>::heap_entry>_>
         ::operator[](&this->heap_,0);
    local_38 = time_traits<boost::posix_time::ptime>::now();
    local_30 = time_traits<boost::posix_time::ptime>::subtract(&t1->time_,&local_38);
    local_28 = time_traits<boost::posix_time::ptime>::to_posix_duration(&local_30);
    this_local = (timer_queue<asio::detail::forwarding_posix_time_traits> *)
                 to_msec<boost::posix_time::time_duration>(this,&local_28,(long)local_20);
  }
  return (long)this_local;
}

Assistant:

virtual long wait_duration_msec(long max_duration) const
  {
    if (heap_.empty())
      return max_duration;

    return this->to_msec(
        Time_Traits::to_posix_duration(
          Time_Traits::subtract(heap_[0].time_, Time_Traits::now())),
        max_duration);
  }